

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

uint Abc_TtCanonicize(word *pTruth,int nVars,char *pCanonPerm)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  size_t __n;
  int iVar8;
  int *piVar9;
  ulong uVar10;
  uint uCanonPhase;
  char *local_b8;
  int local_ac;
  int *local_a8;
  ulong local_a0;
  int pStoreIn [17];
  char pCanonPermCopy [16];
  
  iVar3 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    iVar3 = 1;
  }
  Abc_TtCopy(Abc_TtCanonicize::pCopy1,pTruth,iVar3,0);
  local_b8 = pCanonPerm;
  uCanonPhase = Abc_TtSemiCanonicize(pTruth,nVars,pCanonPerm,pStoreIn,0);
  __n = (size_t)nVars;
  local_a0 = (ulong)(nVars - 2);
  iVar8 = 0;
  local_a8 = pStoreIn + (nVars - 1U);
LAB_00428c48:
  if (iVar8 != 5) {
    uVar4 = 0;
    uVar10 = local_a0 & 0xffffffff;
    piVar9 = local_a8;
    local_ac = iVar8;
    while (iVar8 = local_ac, iVar7 = (int)uVar10, -1 < iVar7) {
      if (pStoreIn[uVar10] == *piVar9) {
        uVar2 = Abc_TtCofactorPerm(pTruth,iVar7,iVar3,(uint)(pStoreIn[uVar10] != pStoreIn[__n] / 2),
                                   local_b8,&uCanonPhase,1);
        uVar4 = uVar4 | uVar2;
      }
      piVar9 = piVar9 + -1;
      uVar10 = (ulong)(iVar7 - 1);
    }
    if (uVar4 != 0) {
      uVar4 = 0;
      lVar5 = 1;
      do {
        iVar7 = (int)lVar5 + -1;
        lVar6 = lVar5;
        do {
          if ((int)(nVars - 1U) <= lVar6) {
            iVar8 = iVar8 + 1;
            if (uVar4 == 0) goto LAB_00428d21;
            goto LAB_00428c48;
          }
          piVar9 = pStoreIn + lVar6;
          lVar5 = lVar6 + 1;
          iVar7 = iVar7 + 1;
          lVar1 = lVar6 + 1;
          lVar6 = lVar5;
        } while (*piVar9 != pStoreIn[lVar1]);
        uVar2 = Abc_TtCofactorPerm(pTruth,iVar7,iVar3,(uint)(*piVar9 != pStoreIn[__n] / 2),local_b8,
                                   &uCanonPhase,1);
        uVar4 = uVar4 | uVar2;
      } while( true );
    }
  }
LAB_00428d21:
  Abc_TtCopy(Abc_TtCanonicize::pCopy2,pTruth,iVar3,0);
  memcpy(pCanonPermCopy,local_b8,__n);
  uVar4 = uCanonPhase;
  Abc_TtImplementNpnConfig(Abc_TtCanonicize::pCopy2,nVars,pCanonPermCopy,uCanonPhase);
  iVar3 = Abc_TtEqual(Abc_TtCanonicize::pCopy1,Abc_TtCanonicize::pCopy2,iVar3);
  if (iVar3 == 0) {
    puts("Canonical form verification failed!");
  }
  return uVar4;
}

Assistant:

unsigned Abc_TtCanonicize( word * pTruth, int nVars, char * pCanonPerm )
{
    int pStoreIn[17];
    unsigned uCanonPhase;
    int i, k, nWords = Abc_TtWordNum( nVars );
    int fNaive = 1;

#ifdef CANON_VERIFY
    char pCanonPermCopy[16];
    static word pCopy1[1024];
    static word pCopy2[1024];
    Abc_TtCopy( pCopy1, pTruth, nWords, 0 );
#endif

    uCanonPhase = Abc_TtSemiCanonicize( pTruth, nVars, pCanonPerm, pStoreIn, 0 );
    for ( k = 0; k < 5; k++ )
    {
        int fChanges = 0;
        for ( i = nVars - 2; i >= 0; i-- )
            if ( pStoreIn[i] == pStoreIn[i+1] )
                fChanges |= Abc_TtCofactorPerm( pTruth, i, nWords, pStoreIn[i] != pStoreIn[nVars]/2, pCanonPerm, &uCanonPhase, fNaive );
        if ( !fChanges )
            break;
        fChanges = 0;
        for ( i = 1; i < nVars - 1; i++ )
            if ( pStoreIn[i] == pStoreIn[i+1] )
                fChanges |= Abc_TtCofactorPerm( pTruth, i, nWords, pStoreIn[i] != pStoreIn[nVars]/2, pCanonPerm, &uCanonPhase, fNaive );
        if ( !fChanges )
            break;
    }

#ifdef CANON_VERIFY
    Abc_TtCopy( pCopy2, pTruth, nWords, 0 );
    memcpy( pCanonPermCopy, pCanonPerm, sizeof(char) * nVars );
    Abc_TtImplementNpnConfig( pCopy2, nVars, pCanonPermCopy, uCanonPhase );
    if ( !Abc_TtEqual( pCopy1, pCopy2, nWords ) )
        printf( "Canonical form verification failed!\n" );
#endif
/*
    if ( !Abc_TtEqual( pCopy1, pCopy2, nWords ) )
    {
        Kit_DsdPrintFromTruth( pCopy1, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( pCopy2, nVars ); printf( "\n" );
        i = 0;
    }
*/
    return uCanonPhase;
}